

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O1

void __thiscall logfault::Log::~Log(Log *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogLevel LVar2;
  LogManager *this_00;
  Message message;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  duration local_90;
  LogLevel local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  Message local_60;
  
  std::__cxx11::stringbuf::str();
  LVar2 = this->level_;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_80,local_78 + (long)local_80);
  local_90.__r = std::chrono::_V2::system_clock::now();
  local_88 = LVar2;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  this_00 = LogManager::Instance();
  paVar1 = &local_60.msg_.field_2;
  local_60.msg_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_b0,local_a8 + (long)local_b0);
  local_60.level_ = local_88;
  local_60.when_.__d.__r = (duration)(duration)local_90.__r;
  LogManager::LogMessage(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.msg_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.msg_._M_dataplus._M_p,local_60.msg_.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->out_);
  std::ios_base::~ios_base((ios_base *)&this->field_0x78);
  return;
}

Assistant:

~Log() {
            Message message(out_.str(), level_);
            LogManager::Instance().LogMessage(message);
        }